

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

Endpoint * __thiscall prometheus::Exposer::GetEndpointForUri(Exposer *this,string *uri)

{
  bool bVar1;
  pointer this_00;
  type args;
  reference this_01;
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  local_a0;
  undefined4 local_94;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  local_90;
  anon_class_32_1_ba1d80cc_for__M_pred local_88;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  local_68;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  local_48;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  it;
  anon_class_32_1_ba1d80cc_for__M_pred sameUri;
  string *uri_local;
  Exposer *this_local;
  
  std::__cxx11::string::string((string *)&it,(string *)uri);
  local_50._M_current =
       (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
        *)std::
          begin<std::vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>>
                    (&this->endpoints_);
  local_68._M_current =
       (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
        *)std::
          end<std::vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>>
                    (&this->endpoints_);
  GetEndpointForUri(std::__cxx11::string_const&)::$_0::__0
            ((__0 *)&local_88,(anon_class_32_1_ba1d80cc_for__M_pred *)&it);
  local_48 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>*,std::vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>>,prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                       (local_50,local_68,&local_88);
  GetEndpointForUri(std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_88);
  local_90._M_current =
       (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
        *)std::
          end<std::vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>>
                    (&this->endpoints_);
  bVar1 = __gnu_cxx::operator!=(&local_48,&local_90);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
              ::operator->(&local_48);
    this_local = (Exposer *)
                 std::
                 unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
                 ::get(this_00);
  }
  else {
    args = std::unique_ptr<CivetServer,_std::default_delete<CivetServer>_>::operator*
                     (&this->server_);
    detail::make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
              ((detail *)&local_a0,args,uri);
    std::
    vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
    ::
    emplace_back<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>
              ((vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
                *)&this->endpoints_,&local_a0);
    std::
    unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>::
    ~unique_ptr(&local_a0);
    this_01 = std::
              vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
              ::back(&this->endpoints_);
    this_local = (Exposer *)
                 std::
                 unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
                 ::get(this_01);
  }
  local_94 = 1;
  GetEndpointForUri(std::__cxx11::string_const&)::$_0::~__0((__0 *)&it);
  return (Endpoint *)this_local;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}